

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O3

display_t *
tchecker::tck_simulate::display_factory
          (display_type_t display_type,ostream *os,shared_ptr<tchecker::zg::zg_t> *zg)

{
  hr_display_t *this;
  runtime_error *this_00;
  
  if (display_type == HUMAN_READABLE_DISPLAY) {
    this = (hr_display_t *)operator_new(0x20);
    hr_display_t::hr_display_t(this,os,zg);
    return &this->super_display_t;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"This should never occur: switch statement is not complete");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tchecker::tck_simulate::display_t * display_factory(enum tchecker::tck_simulate::display_type_t display_type, std::ostream & os,
                                                    std::shared_ptr<tchecker::zg::zg_t> zg)
{
  switch (display_type) {
  case tchecker::tck_simulate::HUMAN_READABLE_DISPLAY:
    return new tchecker::tck_simulate::hr_display_t{os, zg};
#if USE_BOOST_JSON
  case tchecker::tck_simulate::JSON_DISPLAY:
    return new tchecker::tck_simulate::json_display_t{os, zg};
#endif
  default:
    throw std::runtime_error("This should never occur: switch statement is not complete");
  }
}